

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O0

bool __thiscall ComputeM7::Write(ComputeM7 *this,FILE *F_out,char *date,char *version)

{
  int iVar1;
  int iVar2;
  double dVar3;
  reference pp_Var4;
  bool bVar5;
  bool bVar6;
  double frequency_1;
  size_t j_1;
  double frequency;
  size_t j;
  bool ret;
  char *version_local;
  char *date_local;
  FILE *F_out_local;
  ComputeM7 *this_local;
  
  iVar1 = fprintf((FILE *)F_out,"M7.1,%s,%s, , %6f,\n",this->m71,date,version);
  iVar2 = fprintf((FILE *)F_out,"M7.2,%s,%s, , %6f,\n",this->m72,date,version);
  bVar6 = 0 < iVar1 && 0 < iVar2;
  frequency = 0.0;
  while( true ) {
    bVar5 = false;
    if (bVar6) {
      dVar3 = (double)std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::
                      size(&(this->m7Getter).algo_count);
      bVar5 = (ulong)frequency < (ulong)dVar3;
    }
    if (!bVar5) break;
    pp_Var4 = std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::operator[]
                        (&(this->m7Getter).algo_count,(size_type)frequency);
    dVar3 = (*pp_Var4)->algo_frequency;
    iVar1 = (this->m7Getter).nb_tld_queried;
    pp_Var4 = std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::operator[]
                        (&(this->m7Getter).algo_count,(size_type)frequency);
    iVar1 = fprintf((FILE *)F_out,"M7.3,%s,%s, %u, %6f,\n",dVar3 / (double)iVar1,date,version,
                    (ulong)(*pp_Var4)->algo_code);
    bVar6 = (bVar6 & 0 < iVar1) != 0;
    frequency = (double)((long)frequency + 1);
  }
  frequency_1 = 0.0;
  while( true ) {
    bVar5 = false;
    if (bVar6 != false) {
      dVar3 = (double)std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::
                      size(&(this->m7Getter).algo_count);
      bVar5 = (ulong)frequency_1 < (ulong)dVar3;
    }
    if (!bVar5) break;
    pp_Var4 = std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::operator[]
                        (&(this->m7Getter).algo_count,(size_type)frequency_1);
    dVar3 = (*pp_Var4)->algo_frequency_cc;
    iVar1 = (this->m7Getter).nb_cc_tld_queried;
    pp_Var4 = std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::operator[]
                        (&(this->m7Getter).algo_count,(size_type)frequency_1);
    iVar1 = fprintf((FILE *)F_out,"M7.4,%s,%s, %u, %6f,\n",dVar3 / (double)iVar1,date,version,
                    (ulong)(*pp_Var4)->algo_code);
    bVar6 = (bool)(bVar6 & 0 < iVar1);
    frequency_1 = (double)((long)frequency_1 + 1);
  }
  return bVar6;
}

Assistant:

bool ComputeM7::Write(FILE * F_out, char const* date, char const* version)
{
    bool ret = true;

    ret = (fprintf(F_out, "M7.1,%s,%s, , %6f,\n", date, version, m71) > 0);
    ret &= (fprintf(F_out, "M7.2,%s,%s, , %6f,\n", date, version, m72) > 0);

    for (size_t j = 0; ret && j < m7Getter.algo_count.size(); j++) {
        double frequency = m7Getter.algo_count[j]->algo_frequency / ((double)m7Getter.nb_tld_queried);
        ret &= (fprintf(F_out, "M7.3,%s,%s, %u, %6f,\n", date, version, 
            m7Getter.algo_count[j]->algo_code, frequency) > 0);
    }

    for (size_t j = 0; ret && j < m7Getter.algo_count.size(); j++) {
        double frequency = m7Getter.algo_count[j]->algo_frequency_cc / ((double)m7Getter.nb_cc_tld_queried);
        ret &= (fprintf(F_out, "M7.4,%s,%s, %u, %6f,\n", date, version, 
            m7Getter.algo_count[j]->algo_code, frequency) > 0);
    }

    return ret;
}